

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O0

bool32 __thiscall rw::Image::hasAlpha(Image *this)

{
  int local_5c;
  byte *pbStack_58;
  int x_2;
  uint8 *line_2;
  int y_2;
  int x_1;
  uint8 *line_1;
  int y_1;
  int x;
  uint8 *line;
  byte *pbStack_28;
  int y;
  uint8 *pixels;
  uint8 ret;
  Image *this_local;
  
  pixels._7_1_ = 0xff;
  pbStack_28 = this->pixels;
  if (this->depth == 0x20) {
    for (line._4_4_ = 0; line._4_4_ < this->height; line._4_4_ = line._4_4_ + 1) {
      _y_1 = pbStack_28;
      for (line_1._4_4_ = 0; line_1._4_4_ < this->width; line_1._4_4_ = line_1._4_4_ + 1) {
        pixels._7_1_ = pixels._7_1_ & _y_1[3];
        _y_1 = _y_1 + this->bpp;
      }
      pbStack_28 = pbStack_28 + this->stride;
    }
  }
  else {
    if (this->depth == 0x18) {
      return 0;
    }
    if (this->depth == 0x10) {
      for (line_1._0_4_ = 0; (int)line_1 < this->height; line_1._0_4_ = (int)line_1 + 1) {
        _y_2 = pbStack_28;
        for (line_2._4_4_ = 0; line_2._4_4_ < this->width; line_2._4_4_ = line_2._4_4_ + 1) {
          pixels._7_1_ = pixels._7_1_ & _y_2[1] & 0x80;
          _y_2 = _y_2 + this->bpp;
        }
        pbStack_28 = pbStack_28 + this->stride;
      }
      return (uint)(pixels._7_1_ != 0x80);
    }
    if (this->depth < 9) {
      for (line_2._0_4_ = 0; (int)line_2 < this->height; line_2._0_4_ = (int)line_2 + 1) {
        pbStack_58 = pbStack_28;
        for (local_5c = 0; local_5c < this->width; local_5c = local_5c + 1) {
          pixels._7_1_ = pixels._7_1_ & this->palette[(int)((uint)*pbStack_58 * 4 + 3)];
          pbStack_58 = pbStack_58 + this->bpp;
        }
        pbStack_28 = pbStack_28 + this->stride;
      }
    }
  }
  return (uint)(pixels._7_1_ != 0xff);
}

Assistant:

bool32
Image::hasAlpha(void)
{
	uint8 ret = 0xFF;
	uint8 *pixels = this->pixels;
	if(this->depth == 32){
		for(int y = 0; y < this->height; y++){
			uint8 *line = pixels;
			for(int x = 0; x < this->width; x++){
				ret &= line[3];
				line += this->bpp;
			}
			pixels += this->stride;
		}
	}else if(this->depth == 24){
		return 0;
	}else if(this->depth == 16){
		for(int y = 0; y < this->height; y++){
			uint8 *line = pixels;
			for(int x = 0; x < this->width; x++){
				ret &= line[1] & 0x80;
				line += this->bpp;
			}
			pixels += this->stride;
		}
		return ret != 0x80;
	}else if(this->depth <= 8){
		for(int y = 0; y < this->height; y++){
			uint8 *line = pixels;
			for(int x = 0; x < this->width; x++){
				ret &= this->palette[*line*4+3];
				line += this->bpp;
			}
			pixels += this->stride;
		}
	}
	return ret != 0xFF;
}